

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DescriptorPool>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  PlatformInterface *pPVar1;
  long *plVar2;
  undefined8 uVar3;
  Context *pCVar4;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  size_t sVar9;
  deUint64 *pdVar10;
  long *plVar11;
  int *piVar12;
  Parameters *params_00;
  size_type __n;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>_>_>
  objects;
  Environment env;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_238 [16];
  pointer local_228;
  VkAllocationCallbacks *pVStack_220;
  Environment local_218;
  Context *local_1e0;
  Move<vk::Handle<(vk::HandleType)21>_> local_1d8;
  undefined1 local_1b8 [8];
  VkAllocationCallbacks aVStack_1b0 [2];
  ios_base local_140 [272];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar5 = Context::getDeviceInterface(context);
  pVVar6 = Context::getDevice(context);
  local_218.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  params_00 = (Parameters *)context->m_progCollection;
  local_218.maxResourceConsumers = 1;
  local_218.vkp = pPVar1;
  local_218.vkd = pDVar5;
  local_218.device = pVVar6;
  local_218.programBinaries = (BinaryCollection *)params_00;
  local_218.allocationCallbacks = aVStack_1b0;
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  DescriptorPool::create(&local_1d8,&local_218,(Resources *)params,params_00);
  local_228 = (pointer)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                       m_device;
  pVStack_220 = local_1d8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_238._0_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_238._8_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  if (local_238._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_238 + 8),
               (VkDescriptorPool)local_238._0_8_);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8);
  sVar7 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar8 - sVar7,0);
  __n = 0x4000;
  if (sVar7 < 0x4000) {
    __n = sVar7;
  }
  local_218.vkp = context->m_platformInterface;
  local_218.vkd = Context::getDeviceInterface(context);
  local_218.device = Context::getDevice(context);
  local_218.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_218.programBinaries = context->m_progCollection;
  local_218.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_218.maxResourceConsumers = (deUint32)__n;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>_>_>
            *)local_238,__n,(allocator_type *)local_1b8);
  local_1b8 = (undefined1  [8])context->m_testCtx->m_log;
  local_1e0 = context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aVStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aVStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)21>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)((DeviceInterface *)((long)aVStack_1b0[0].pUserData + -0x18))->
                         _vptr_DeviceInterface + (int)aVStack_1b0);
  }
  else {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0,__s,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aVStack_1b0);
  std::ios_base::~ios_base(local_140);
  if (sVar7 != 0) {
    lVar14 = 8;
    uVar13 = 0;
    do {
      pdVar10 = (deUint64 *)operator_new(0x20);
      DescriptorPool::create
                ((Move<vk::Handle<(vk::HandleType)21>_> *)local_1b8,&local_218,(Resources *)params,
                 params_00);
      pdVar10[2] = (deUint64)aVStack_1b0[0].pfnAllocation;
      pdVar10[3] = (deUint64)aVStack_1b0[0].pfnReallocation;
      *pdVar10 = (deUint64)local_1b8;
      pdVar10[1] = (deUint64)aVStack_1b0[0].pUserData;
      local_1b8 = (undefined1  [8])0x0;
      aVStack_1b0[0].pUserData = (DeviceInterface *)0x0;
      aVStack_1b0[0].pfnAllocation = (PFN_vkAllocationFunction)0x0;
      aVStack_1b0[0].pfnReallocation = (PFN_vkReallocationFunction)0x0;
      plVar11 = (long *)operator_new(0x20);
      uVar3 = local_238._0_8_;
      *(undefined4 *)(plVar11 + 1) = 0;
      *(undefined4 *)((long)plVar11 + 0xc) = 0;
      *plVar11 = (long)&PTR__SharedPtrState_00d24b50;
      plVar11[2] = (long)pdVar10;
      *(undefined4 *)(plVar11 + 1) = 1;
      *(undefined4 *)((long)plVar11 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)21>_> **)local_238._0_8_ + lVar14
                         );
      if (plVar2 != plVar11) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_238._0_8_ + lVar14 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)21>_> **)
                                           local_238._0_8_ + lVar14) + 0x10))();
          }
          LOCK();
          piVar12 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)21>_> **)uVar3 +
                                     lVar14) + 0xc);
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)21>_> **)uVar3 + lVar14);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)21>_> **)uVar3 + lVar14) = 0;
          }
        }
        *(deUint64 **)(uVar3 + lVar14 + -8) = pdVar10;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)21>_> **)uVar3 + lVar14) = plVar11;
        LOCK();
        *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
        UNLOCK();
        LOCK();
        piVar12 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)21>_> **)uVar3 + lVar14
                                   ) + 0xc);
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      plVar2 = plVar11 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar11 + 0x10))(plVar11);
      }
      pCVar4 = local_1e0;
      piVar12 = (int *)((long)plVar11 + 0xc);
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      if (local_1b8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)aVStack_1b0,
                   (VkDescriptorPool)local_1b8);
      }
      bVar15 = (uVar13 & 0x3ff) != 0;
      params_00 = (Parameters *)CONCAT71((int7)((ulong)params_00 >> 8),bVar15 || uVar13 == 0);
      if (!bVar15 && uVar13 != 0) {
        tcu::TestContext::touchWatchdog(pCVar4->m_testCtx);
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (__n != uVar13);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>_>_>
                     *)local_238,(pointer)local_238._0_8_);
  local_1b8 = (undefined1  [8])&aVStack_1b0[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b8,
             (undefined1 *)((long)(_func_int ***)aVStack_1b0[0].pUserData + (long)local_1b8));
  if (local_1b8 != (undefined1  [8])&aVStack_1b0[0].pfnAllocation) {
    operator_delete((void *)local_1b8,(ulong)(aVStack_1b0[0].pfnAllocation + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>_>_>_>
             *)local_238);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}